

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

void __thiscall
tinyusdz::primvar::PrimVar::set_value<std::array<float,3ul>>(PrimVar *this,array<float,_3UL> *v)

{
  array<float,_3UL> *v_local;
  PrimVar *this_local;
  
  tinyusdz::value::Value::operator=(&this->_value,v);
  return;
}

Assistant:

void set_value(const T &v) {
    _value = v;
  }